

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O0

void mnf::ExpMapMatrix::applyInvTransport_
               (RefMat *out,ConstRefMat *in,ConstRefVec *param_3,ConstRefVec *param_4)

{
  ConstRefVec *param_3_local;
  ConstRefVec *param_2_local;
  ConstRefMat *in_local;
  RefMat *out_local;
  
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::operator=
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> *)out,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              *)in);
  return;
}

Assistant:

void ExpMapMatrix::applyInvTransport_(RefMat out, const ConstRefMat& in,
                                      const ConstRefVec&, const ConstRefVec&)
{
  // OutputType E;
  // exponential(E,v);
  // Eigen::Map<Eigen::MatrixXd, Eigen::Aligned> a = m.getMap(in.rows(),
  // InputDim_);
  // a.noalias() = in*(E.transpose());
  // out = a;
  // TODO Make sure that out=in is OK here...
  out = in;
}